

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

ostream * __thiscall wasm::anon_unknown_0::TypePrinter::print(TypePrinter *this,Type type)

{
  bool bVar1;
  HeapType type_00;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  uint uVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  Type local_30;
  Type type_local;
  
  local_30.id = type.id;
  if (type.id < 7) {
    switch(type.id & 0xffffffff) {
    case 0:
      poVar4 = this->os;
      pcVar3 = "none";
      goto LAB_00cc2d3f;
    case 1:
      poVar4 = this->os;
      pcVar3 = "unreachable";
      lVar2 = 0xb;
      goto LAB_00cc2d44;
    case 2:
      poVar4 = this->os;
      pcVar3 = "i32";
      break;
    case 3:
      poVar4 = this->os;
      pcVar3 = "i64";
      break;
    case 4:
      poVar4 = this->os;
      pcVar3 = "f32";
      break;
    case 5:
      poVar4 = this->os;
      pcVar3 = "f64";
      break;
    case 6:
      poVar4 = this->os;
      pcVar3 = "v128";
LAB_00cc2d3f:
      lVar2 = 4;
      goto LAB_00cc2d44;
    default:
      goto switchD_00cc2b6f_default;
    }
    lVar2 = 3;
LAB_00cc2d44:
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar2);
    return poVar4;
  }
switchD_00cc2b6f_default:
  if ((type.id & 1) != 0 && 6 < type.id) {
    print(this,(Tuple *)(type.id & 0xfffffffffffffffe));
    goto LAB_00cc2e56;
  }
  if ((type.id < 7) || ((type.id & 1) != 0)) {
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x6d3);
  }
  type_00 = wasm::Type::getHeapType(&local_30);
  bVar7 = local_30.id < 7;
  bVar9 = ((uint)local_30.id & 3) != 2;
  bVar8 = 0x7c < type_00.id;
  uVar5 = (uint)type_00.id;
  cVar6 = (char)((uVar5 & 4) >> 2);
  if (((cVar6 != '\0' || bVar8) || bVar7) || bVar9) {
    std::__ostream_insert<char,std::char_traits<char>>(this->os,"(ref ",5);
    if (((uint)local_30.id & 3) == 2 && 6 < local_30.id) {
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"null ",5);
    }
    bVar1 = wasm::Type::isExact(&local_30);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(this->os,"(exact ",7);
    }
    printHeapTypeName(this,type_00);
    bVar1 = wasm::Type::isExact(&local_30);
    if (bVar1) {
      type_local.id._6_1_ = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>
                (this->os,(char *)((long)&type_local.id + 6),1);
    }
    type_local.id._5_1_ = 0x29;
    std::__ostream_insert<char,std::char_traits<char>>
              (this->os,(char *)((long)&type_local.id + 5),1);
    goto LAB_00cc2e51;
  }
  bVar1 = wasm::Type::isExact(&local_30);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(this->os,"(exact ",7);
  }
  switch(uVar5 << 0x1d | uVar5 - 8 >> 3) {
  case 0:
    poVar4 = this->os;
    pcVar3 = "externref";
    goto LAB_00cc2e01;
  case 1:
    poVar4 = this->os;
    pcVar3 = "funcref";
    goto LAB_00cc2e12;
  case 2:
    poVar4 = this->os;
    pcVar3 = "contref";
    goto LAB_00cc2e12;
  case 3:
    poVar4 = this->os;
    pcVar3 = "anyref";
    goto LAB_00cc2e23;
  case 4:
    poVar4 = this->os;
    pcVar3 = "eqref";
    lVar2 = 5;
    break;
  case 5:
    poVar4 = this->os;
    pcVar3 = "i31ref";
    goto LAB_00cc2e23;
  case 6:
    poVar4 = this->os;
    pcVar3 = "structref";
    goto LAB_00cc2e01;
  case 7:
    poVar4 = this->os;
    pcVar3 = "arrayref";
    lVar2 = 8;
    break;
  case 8:
    poVar4 = this->os;
    pcVar3 = "exnref";
LAB_00cc2e23:
    lVar2 = 6;
    break;
  case 9:
    poVar4 = this->os;
    pcVar3 = "stringref";
LAB_00cc2e01:
    lVar2 = 9;
    break;
  case 10:
    poVar4 = this->os;
    pcVar3 = "nullref";
LAB_00cc2e12:
    lVar2 = 7;
    break;
  case 0xb:
    poVar4 = this->os;
    pcVar3 = "nullexternref";
    lVar2 = 0xd;
    break;
  case 0xc:
    poVar4 = this->os;
    pcVar3 = "nullfuncref";
    goto LAB_00cc2df0;
  case 0xd:
    poVar4 = this->os;
    pcVar3 = "nullcontref";
LAB_00cc2df0:
    lVar2 = 0xb;
    break;
  case 0xe:
    poVar4 = this->os;
    pcVar3 = "nullexnref";
    lVar2 = 10;
    break;
  default:
    goto switchD_00cc2cde_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar2);
switchD_00cc2cde_default:
  bVar1 = wasm::Type::isExact(&local_30);
  if (bVar1) {
    type_local.id._7_1_ = 0x29;
    std::__ostream_insert<char,std::char_traits<char>>
              (this->os,(char *)((long)&type_local.id + 7),1);
  }
  type_00.id = (uintptr_t)this->os;
LAB_00cc2e51:
  if (((cVar6 != '\0' || bVar8) || bVar7) || bVar9) {
LAB_00cc2e56:
    type_00.id = (uintptr_t)this->os;
  }
  return (ostream *)type_00.id;
}

Assistant:

std::ostream& TypePrinter::print(Type type) {
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::none:
        return os << "none";
      case Type::unreachable:
        return os << "unreachable";
      case Type::i32:
        return os << "i32";
      case Type::i64:
        return os << "i64";
      case Type::f32:
        return os << "f32";
      case Type::f64:
        return os << "f64";
      case Type::v128:
        return os << "v128";
    }
  }

#if TRACE_CANONICALIZATION
  os << "(;" << ((type.getID() >> 4) % 1000) << ";) ";
#endif
  if (type.isTuple()) {
    print(type.getTuple());
  } else if (type.isRef()) {
    auto heapType = type.getHeapType();
    if (type.isNullable() && heapType.isBasic() && !heapType.isShared()) {
      if (type.isExact()) {
        os << "(exact ";
      }
      // Print shorthands for certain basic heap types.
      switch (heapType.getBasic(Unshared)) {
        case HeapType::ext:
          os << "externref";
          break;
        case HeapType::func:
          os << "funcref";
          break;
        case HeapType::cont:
          os << "contref";
          break;
        case HeapType::any:
          os << "anyref";
          break;
        case HeapType::eq:
          os << "eqref";
          break;
        case HeapType::i31:
          os << "i31ref";
          break;
        case HeapType::struct_:
          os << "structref";
          break;
        case HeapType::array:
          os << "arrayref";
          break;
        case HeapType::exn:
          os << "exnref";
          break;
        case HeapType::string:
          os << "stringref";
          break;
        case HeapType::none:
          os << "nullref";
          break;
        case HeapType::noext:
          os << "nullexternref";
          break;
        case HeapType::nofunc:
          os << "nullfuncref";
          break;
        case HeapType::nocont:
          os << "nullcontref";
          break;
        case HeapType::noexn:
          os << "nullexnref";
          break;
      }
      if (type.isExact()) {
        os << ')';
      }
      return os;
    }
    os << "(ref ";
    if (type.isNullable()) {
      os << "null ";
    }
    if (type.isExact()) {
      os << "(exact ";
    }
    printHeapTypeName(heapType);
    if (type.isExact()) {
      os << ')';
    }
    os << ')';
  } else {
    WASM_UNREACHABLE("unexpected type");
  }
  return os;
}